

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-reader.c
# Opt level: O3

int check_boms(void)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  test_case *ptVar4;
  char *pcVar5;
  uint uVar6;
  uchar *input;
  yaml_char_t *pyVar7;
  char *__format;
  size_t size;
  long lVar8;
  yaml_parser_t parser;
  yaml_parser_t local_210;
  
  puts("checking boms...");
  if (boms[0].test == (char *)0x0) {
    uVar6 = 0;
  }
  else {
    ptVar4 = boms;
    lVar8 = 0;
    uVar6 = 0;
    input = (uchar *)boms[0].test;
    do {
      uVar1 = ptVar4->result;
      size = 0xffffffffffffffff;
      do {
        lVar2 = size + 1;
        size = size + 1;
      } while (input[lVar2] != '!');
      printf("\t%s: ",ptVar4->title);
      yaml_parser_initialize(&local_210);
      yaml_parser_set_input_string(&local_210,input,size);
      iVar3 = yaml_parser_update_buffer(&local_210,size);
      pyVar7 = local_210.buffer.start;
      pcVar5 = bom_original;
      if (iVar3 == 0) {
        __format = "- (reader error: %s at %ld)\n";
        pcVar5 = (char *)local_210.problem_offset;
        pyVar7 = (yaml_char_t *)local_210.problem;
LAB_00102476:
        printf(__format,pyVar7,pcVar5);
LAB_00102493:
        uVar6 = uVar6 + 1;
      }
      else {
        if (local_210.unread != (long)(int)uVar1) {
          printf("- (length=%ld while expected length=%d)\n",local_210.unread,(ulong)uVar1);
          goto LAB_00102493;
        }
        iVar3 = bcmp(local_210.buffer.start,bom_original,local_210.unread);
        if (iVar3 != 0) {
          __format = "- (value \'%s\' does not equal to the original value \'%s\')\n";
          goto LAB_00102476;
        }
        puts("+");
      }
      yaml_parser_delete(&local_210);
      lVar8 = lVar8 + 1;
      ptVar4 = boms + lVar8;
      input = (uchar *)boms[lVar8].test;
    } while (input != (uchar *)0x0);
  }
  printf("checking boms: %d fail(s)\n",(ulong)uVar6);
  return uVar6;
}

Assistant:

int check_boms(void)
{
    yaml_parser_t parser;
    int failed = 0;
    int k;
    printf("checking boms...\n");
    for (k = 0; boms[k].test; k++) {
        char *title = boms[k].title;
        int check = boms[k].result;
        int result;
        char *start = boms[k].test;
        char *end = start;
        while (*end != '!') end++;
        printf("\t%s: ", title);
        yaml_parser_initialize(&parser);
        yaml_parser_set_input_string(&parser, (unsigned char *)start, end-start);
        result = yaml_parser_update_buffer(&parser, end-start);
        if (!result) {
            printf("- (reader error: %s at %ld)\n", parser.problem, (long)parser.problem_offset);
            failed++;
        }
        else {
            if (parser.unread != check) {
                printf("- (length=%ld while expected length=%d)\n", (long)parser.unread, check);
                failed++;
            }
            else if (memcmp(parser.buffer.start, bom_original, check) != 0) {
                printf("- (value '%s' does not equal to the original value '%s')\n", parser.buffer.start, bom_original);
                failed++;
            }
            else {
                printf("+\n");
            }
        }
        yaml_parser_delete(&parser);
    }
    printf("checking boms: %d fail(s)\n", failed);
    return failed;
}